

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O2

bool google::ParseSourceName(State *state)

{
  char *str;
  char *pcVar1;
  undefined4 length_00;
  bool bVar2;
  long lVar3;
  long lVar4;
  State copy;
  int length;
  
  pcVar1 = state->mangled_cur;
  copy.mangled_cur = state->out_cur;
  copy.out_cur = state->out_begin;
  copy.out_begin = state->out_end;
  copy.out_end = state->prev_name;
  copy.prev_name = *(char **)&state->prev_name_length;
  copy.nest_level = -1;
  copy.append = true;
  copy.overflowed = true;
  bVar2 = ParseNumber(state,(int *)&copy.nest_level);
  length_00 = copy._44_4_;
  if ((!bVar2) || (lVar4 = (long)(int)copy._44_4_, lVar4 == -1)) {
LAB_0011ff24:
    state->out_begin = copy.out_cur;
    state->out_end = copy.out_begin;
    state->prev_name = copy.out_end;
    *(char **)&state->prev_name_length = copy.prev_name;
    state->mangled_cur = pcVar1;
    state->out_cur = copy.mangled_cur;
    state->out_begin = copy.out_cur;
    state->out_end = copy.out_begin;
    return false;
  }
  str = state->mangled_cur;
  bVar2 = AtLeastNumCharsRemaining(str,copy._44_4_);
  if (!bVar2) goto LAB_0011ff24;
  if (0xb < (int)length_00) {
    lVar3 = 0;
    while( true ) {
      if ((str[lVar3] == '\0') || (str[lVar3] != "_GLOBAL__N_"[lVar3])) break;
      lVar3 = lVar3 + 1;
    }
    if ("_GLOBAL__N_"[lVar3] == '\0') {
      MaybeAppend(state,"(anonymous namespace)");
      goto LAB_0011ff59;
    }
  }
  MaybeAppendWithLength(state,str,length_00);
LAB_0011ff59:
  state->mangled_cur = state->mangled_cur + lVar4;
  return true;
}

Assistant:

static bool ParseSourceName(State *state) {
  State copy = *state;
  int length = -1;
  if (ParseNumber(state, &length) && ParseIdentifier(state, length)) {
    return true;
  }
  *state = copy;
  return false;
}